

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_359b51::BuildEngineImpl::RuleInfo::RuleInfo
          (RuleInfo *this,KeyID keyID,
          unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *rule)

{
  CommandSignature *this_00;
  DependencyKeyIDs *this_01;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *rule_local;
  RuleInfo *this_local;
  KeyID keyID_local;
  
  (this->keyID)._value = keyID._value;
  std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::unique_ptr
            (&this->rule,rule);
  (this->inProgressInfo).pendingScanRecord = (RuleScanRecord *)0x0;
  memset(&this->result,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&(this->result).value);
  this_00 = &(this->result).signature;
  memset(this_00,0,8);
  llbuild::basic::CommandSignature::CommandSignature(this_00);
  (this->result).computedAt = 0;
  (this->result).builtAt = 0;
  this_01 = &(this->result).dependencies;
  memset(this_01,0,0x30);
  llbuild::core::DependencyKeyIDs::DependencyKeyIDs(this_01);
  (this->result).start = 0.0;
  (this->result).end = 0.0;
  this->state = Incomplete;
  this->wasForced = false;
  return;
}

Assistant:

RuleInfo(KeyID keyID, std::unique_ptr<Rule>&& rule) : keyID(keyID), rule(std::move(rule)) {}